

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O0

int __thiscall
TimidityPPMIDIDevice::Open
          (TimidityPPMIDIDevice *this,_func_void_uint_void_ptr_DWORD_DWORD *callback,void *userdata)

{
  SoundRenderer *pSVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  size_t sVar7;
  char *tail;
  uint uVar8;
  char local_4f;
  char local_4d;
  uint local_24;
  int pipeSize;
  void *userdata_local;
  _func_void_uint_void_ptr_DWORD_DWORD *callback_local;
  TimidityPPMIDIDevice *this_local;
  
  iVar4 = FIntCVar::operator_cast_to_int(&timidity_pipe);
  iVar5 = FIntCVar::operator_cast_to_int(&timidity_frequency);
  bVar2 = FBoolCVar::operator_cast_to_bool(&timidity_stereo);
  bVar3 = FBoolCVar::operator_cast_to_bool(&timidity_8bit);
  local_24 = (iVar4 * iVar5) / 1000 << bVar2 + ((bVar3 ^ 0xffU) & 1);
  iVar4 = pipe(this->WavePipe);
  pSVar1 = GSnd;
  if (iVar4 == -1) {
    Printf(200,"Could not create a data pipe for TiMidity++.\n");
    local_24 = 0;
  }
  else {
    bVar2 = FBoolCVar::operator_cast_to_bool(&timidity_stereo);
    bVar3 = FBoolCVar::operator_cast_to_bool(&timidity_8bit);
    uVar8 = 0;
    if (bVar3) {
      uVar8 = 2;
    }
    uVar6 = FIntCVar::operator_cast_to_int(&timidity_frequency);
    iVar4 = (*pSVar1->_vptr_SoundRenderer[0xb])
                      (pSVar1,FillStream,(ulong)local_24,(ulong)(!bVar2 | uVar8),(ulong)uVar6,this);
    (this->super_PseudoMIDIDevice).Stream = (SoundStream *)CONCAT44(extraout_var,iVar4);
    if ((this->super_PseudoMIDIDevice).Stream == (SoundStream *)0x0) {
      Printf(200,"Could not create music stream.\n");
      local_24 = 0;
      close(this->WavePipe[1]);
      close(this->WavePipe[0]);
      this->WavePipe[1] = -1;
      this->WavePipe[0] = -1;
    }
  }
  if (local_24 == 0) {
    Printf(200,
           "If your soundcard cannot play more than one\nwave at a time, you will hear no music.\n")
    ;
    FString::operator+=(&this->CommandLine,"-Od");
  }
  else {
    FString::operator+=(&this->CommandLine,"-o - -Ors");
  }
  bVar2 = FBoolCVar::operator_cast_to_bool(&timidity_stereo);
  local_4d = 'S';
  if (!bVar2) {
    local_4d = 'M';
  }
  FString::operator+=(&this->CommandLine,local_4d);
  bVar2 = FBoolCVar::operator_cast_to_bool(&timidity_8bit);
  local_4f = '8';
  if (!bVar2) {
    local_4f = '1';
  }
  FString::operator+=(&this->CommandLine,local_4f);
  bVar2 = FBoolCVar::operator_cast_to_bool(&timidity_byteswap);
  if (bVar2) {
    FString::operator+=(&this->CommandLine,'x');
  }
  sVar7 = FString::Len(&this->CommandLine);
  this->LoopPos = sVar7 + 4;
  FString::operator+=(&this->CommandLine," -idl ");
  tail = FTempFileName::GetName(&this->DiskName);
  FString::operator+=(&this->CommandLine,tail);
  return 0;
}

Assistant:

int TimidityPPMIDIDevice::Open(void (*callback)(unsigned int, void *, DWORD, DWORD), void *userdata)
{
	int pipeSize;

#ifdef _WIN32
	static SECURITY_ATTRIBUTES inheritable = { sizeof(inheritable), NULL, TRUE };
	
	if (!Validated && !ValidateTimidity ())
	{
		return 101;
	}

	Validated = true;
#endif // WIN32

	pipeSize = (timidity_pipe * timidity_frequency / 1000)
		<< (timidity_stereo + !timidity_8bit);

	{
#ifdef _WIN32
		// Round pipe size up to nearest power of 2 to try and avoid partial
		// buffer reads in FillStream() under NT. This does not seem to be an
		// issue under 9x.
		int bitmask = pipeSize & -pipeSize;
		
		while (bitmask < pipeSize)
			bitmask <<= 1;
		pipeSize = bitmask;

		if (!CreatePipe(&ReadWavePipe, &WriteWavePipe, &inheritable, pipeSize))
#else // WIN32
		if (pipe (WavePipe) == -1)
#endif
		{
			Printf(PRINT_BOLD, "Could not create a data pipe for TiMidity++.\n");
			pipeSize = 0;
		}
		else
		{
			Stream = GSnd->CreateStream(FillStream, pipeSize,
				(timidity_stereo ? 0 : SoundStream::Mono) |
				(timidity_8bit ? SoundStream::Bits8 : 0),
				timidity_frequency, this);
			if (Stream == NULL)
			{
				Printf(PRINT_BOLD, "Could not create music stream.\n");
				pipeSize = 0;
#ifdef _WIN32
				CloseHandle(WriteWavePipe);
				CloseHandle(ReadWavePipe);
				ReadWavePipe = WriteWavePipe = INVALID_HANDLE_VALUE;
#else
				close(WavePipe[1]);
				close(WavePipe[0]);
				WavePipe[0] = WavePipe[1] = -1;
#endif
			}
		}
		
		if (pipeSize == 0)
		{
			Printf(PRINT_BOLD, "If your soundcard cannot play more than one\n"
								"wave at a time, you will hear no music.\n");
		}
		else
		{
			CommandLine += "-o - -Ors";
		}
	}

	if (pipeSize == 0)
	{
		CommandLine += "-Od";
	}

	CommandLine += timidity_stereo ? 'S' : 'M';
	CommandLine += timidity_8bit ? '8' : '1';
	if (timidity_byteswap)
	{
		CommandLine += 'x';
	}

	LoopPos = CommandLine.Len() + 4;

	CommandLine += " -idl ";
	CommandLine += DiskName.GetName();
	return 0;
}